

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

int __thiscall
embree::SceneLoadingTutorialApplication::main
          (SceneLoadingTutorialApplication *this,int argc,char **argv)

{
  undefined1 *this_00;
  pointer pfVar1;
  pointer pFVar2;
  GroupNode *pGVar3;
  PerspectiveCameraNode *pPVar4;
  double dVar5;
  Application *pAVar6;
  __type _Var7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  runtime_error *this_01;
  ulong uVar11;
  char **argv_00;
  pointer pFVar12;
  pointer pSVar13;
  long lVar14;
  function<void_()> *f;
  pointer this_02;
  pointer pSVar15;
  allocator local_169;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cam;
  Ref<embree::SceneGraph::GroupNode> local_138;
  Ref<embree::SceneGraph::Node> local_130;
  Ref<embree::SceneGraph::GroupNode> local_128;
  Ref<embree::SceneGraph::Node> local_120;
  Ref<embree::SceneGraph::Node> local_118;
  Ref<embree::SceneGraph::Node> local_110;
  Ref<embree::SceneGraph::GroupNode> flattened_scene;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  
  CommandLineParser::parseCommandLine
            (&(this->super_TutorialApplication).super_Application.commandLineParser,argc,argv);
  (*(this->super_TutorialApplication).super_Application._vptr_Application[3])(this);
  TutorialApplication::create_device(&this->super_TutorialApplication);
  dVar5 = (double)std::__cxx11::string::string
                            ((string *)local_e8,"application start",(allocator *)&flattened_scene);
  Application::log((Application *)this,dVar5);
  std::__cxx11::string::~string((string *)local_e8);
  pfVar1 = (this->futures).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->futures).
                 super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pfVar1; this_02 = this_02 + 1
      ) {
    std::function<void_()>::operator()(this_02);
  }
  pFVar12 = (this->sceneFilename).
            super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar2 = (this->sceneFilename).
           super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar2 != pFVar12) {
    for (; pFVar12 != pFVar2; pFVar12 = pFVar12 + 1) {
      FileName::ext_abi_cxx11_((string *)&flattened_scene,pFVar12);
      toLowerCase((string *)local_e8,(string *)&flattened_scene);
      std::__cxx11::string::string((string *)&cam,"obj",&local_169);
      _Var7 = std::operator==((string *)local_e8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cam);
      std::__cxx11::string::~string((string *)&cam);
      std::__cxx11::string::~string((string *)local_e8);
      std::__cxx11::string::~string((string *)&flattened_scene);
      if (_Var7) {
        pGVar3 = (this->scene).ptr;
        bVar8 = std::operator!=(&this->subdiv_mode,"");
        loadOBJ((embree *)local_e8,pFVar12,bVar8,false);
        SceneGraph::GroupNode::add(pGVar3,(Ref<embree::SceneGraph::Node> *)local_e8);
        if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 0x18))();
        }
      }
      else {
        FileName::ext_abi_cxx11_((string *)local_e8,pFVar12);
        bVar8 = std::operator!=((string *)local_e8,"");
        std::__cxx11::string::~string((string *)local_e8);
        if (bVar8) {
          pGVar3 = (this->scene).ptr;
          SceneGraph::load((SceneGraph *)local_e8,pFVar12,false);
          SceneGraph::GroupNode::add(pGVar3,(Ref<embree::SceneGraph::Node> *)local_e8);
          if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 0x18))();
          }
        }
      }
    }
  }
  pAVar6 = Application::instance;
  dVar5 = (double)std::__cxx11::string::string
                            ((string *)local_e8,"loading scene done",(allocator *)&flattened_scene);
  Application::log(pAVar6,dVar5);
  std::__cxx11::string::~string((string *)local_e8);
  lVar14 = 0;
  uVar11 = 0;
  while( true ) {
    pFVar12 = (this->keyFramesFilenames).
              super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->keyFramesFilenames).
                      super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pFVar12 >> 5) <= uVar11)
    break;
    if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Adding [");
      poVar10 = operator<<(poVar10,(FileName *)
                                   ((long)&(((this->keyFramesFilenames).
                                             super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->filename).
                                           _M_dataplus._M_p + lVar14));
      std::operator<<(poVar10,"] to scene...");
      std::ostream::flush();
      pFVar12 = (this->keyFramesFilenames).
                super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    FileName::ext_abi_cxx11_
              ((string *)&flattened_scene,
               (FileName *)((long)&(pFVar12->filename)._M_dataplus._M_p + lVar14));
    toLowerCase((string *)local_e8,(string *)&flattened_scene);
    std::__cxx11::string::string((string *)&cam,"obj",&local_169);
    _Var7 = std::operator==((string *)local_e8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cam);
    std::__cxx11::string::~string((string *)&cam);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&flattened_scene);
    if (_Var7) {
      pGVar3 = (this->scene).ptr;
      pFVar12 = (this->keyFramesFilenames).
                super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar8 = std::operator!=(&this->subdiv_mode,"");
      loadOBJ((embree *)local_e8,(FileName *)((long)&(pFVar12->filename)._M_dataplus._M_p + lVar14),
              bVar8,true);
      SceneGraph::GroupNode::add(pGVar3,(Ref<embree::SceneGraph::Node> *)local_e8);
      if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 0x18))();
      }
    }
    else {
      FileName::ext_abi_cxx11_
                ((string *)local_e8,
                 (FileName *)
                 ((long)&(((this->keyFramesFilenames).
                           super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>.
                           _M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus._M_p +
                 lVar14));
      bVar8 = std::operator!=((string *)local_e8,"");
      std::__cxx11::string::~string((string *)local_e8);
      if (bVar8) {
        pGVar3 = (this->scene).ptr;
        SceneGraph::load((SceneGraph *)local_e8,
                         (FileName *)
                         ((long)&(((this->keyFramesFilenames).
                                   super__Vector_base<embree::FileName,_std::allocator<embree::FileName>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus
                                 ._M_p + lVar14),false);
        SceneGraph::GroupNode::add(pGVar3,(Ref<embree::SceneGraph::Node> *)local_e8);
        if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 0x18))();
        }
      }
    }
    if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
      poVar10 = std::operator<<((ostream *)&std::cout," [DONE]");
      std::endl<char,std::char_traits<char>>(poVar10);
      std::ostream::flush();
    }
    uVar11 = uVar11 + 1;
    lVar14 = lVar14 + 0x20;
  }
  Texture::clearTextureCache();
  if (this->remove_mblur == true) {
    SceneGraph::GroupNode::remove_mblur((this->scene).ptr,true);
  }
  if (this->remove_non_mblur == true) {
    SceneGraph::GroupNode::remove_mblur((this->scene).ptr,false);
  }
  pSVar15 = (this->sgop).
            super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pSVar13 = (this->sgop).
            super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pSVar15 != pSVar13) && (0 < (this->super_TutorialApplication).super_Application.verbosity)) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar10 = std::operator<<((ostream *)&std::cout,"scene statistics (pre-convert):");
    std::endl<char,std::char_traits<char>>(poVar10);
    local_110.ptr = &((this->scene).ptr)->super_Node;
    if ((GroupNode *)local_110.ptr != (GroupNode *)0x0) {
      (*(((Node *)&(local_110.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
    }
    SceneGraph::calculateStatistics((Statistics *)local_e8,&local_110);
    SceneGraph::Statistics::print((Statistics *)local_e8);
    if ((GroupNode *)local_110.ptr != (GroupNode *)0x0) {
      (*(((Node *)&(local_110.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    pSVar13 = (this->sgop).
              super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar15 = (this->sgop).
              super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pAVar6 = Application::instance, pSVar13 != pSVar15; pSVar13 = pSVar13 + 1) {
    switch(*pSVar13) {
    case CONVERT_TRIANGLES_TO_QUADS:
      SceneGraph::GroupNode::triangles_to_quads((this->scene).ptr,this->convert_tris_to_quads_prop);
      break;
    case CONVERT_BEZIER_TO_LINES:
      SceneGraph::GroupNode::bezier_to_lines((this->scene).ptr);
      break;
    case CONVERT_BEZIER_TO_BSPLINE:
      SceneGraph::GroupNode::bezier_to_bspline((this->scene).ptr);
      break;
    case CONVERT_BEZIER_TO_HERMITE:
      SceneGraph::GroupNode::bezier_to_hermite((this->scene).ptr);
      break;
    case CONVERT_BSPLINE_TO_BEZIER:
      SceneGraph::GroupNode::bspline_to_bezier((this->scene).ptr);
      break;
    case CONVERT_FLAT_TO_ROUND_CURVES:
      SceneGraph::GroupNode::flat_to_round_curves((this->scene).ptr);
      break;
    case CONVERT_ROUND_TO_FLAT_CURVES:
      SceneGraph::GroupNode::round_to_flat_curves((this->scene).ptr);
      break;
    case MERGE_QUADS_TO_GRIDS:
      SceneGraph::GroupNode::merge_quads_to_grids((this->scene).ptr);
      break;
    case CONVERT_QUADS_TO_GRIDS:
      SceneGraph::GroupNode::quads_to_grids((this->scene).ptr,this->grid_resX,this->grid_resY);
      break;
    case CONVERT_GRIDS_TO_QUADS:
      SceneGraph::GroupNode::grids_to_quads((this->scene).ptr);
      break;
    case CONVERT_MBLUR_TO_NONMBLUR:
      local_118.ptr = &((this->scene).ptr)->super_Node;
      if ((GroupNode *)local_118.ptr != (GroupNode *)0x0) {
        (*(((Node *)&(local_118.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
      }
      SceneGraph::convert_mblur_to_nonmblur(&local_118);
      if ((GroupNode *)local_118.ptr != (GroupNode *)0x0) {
        (*(((Node *)&(local_118.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
      }
      break;
    default:
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"unsupported scene graph operation");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  dVar5 = (double)std::__cxx11::string::string
                            ((string *)local_e8,"converting scene done",
                             (allocator *)&flattened_scene);
  Application::log(pAVar6,dVar5);
  std::__cxx11::string::~string((string *)local_e8);
  if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar10 = std::operator<<((ostream *)&std::cout,"scene statistics (pre-flattening):");
    std::endl<char,std::char_traits<char>>(poVar10);
    local_120.ptr = &((this->scene).ptr)->super_Node;
    if ((GroupNode *)local_120.ptr != (GroupNode *)0x0) {
      (*(((Node *)&(local_120.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
    }
    SceneGraph::calculateStatistics((Statistics *)local_e8,&local_120);
    SceneGraph::Statistics::print((Statistics *)local_e8);
    if ((GroupNode *)local_120.ptr != (GroupNode *)0x0) {
      (*(((Node *)&(local_120.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  local_128.ptr = (this->scene).ptr;
  if (local_128.ptr != (GroupNode *)0x0) {
    (*((local_128.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  SceneGraph::flatten((SceneGraph *)&flattened_scene,&local_128,this->instancing_mode);
  if (local_128.ptr != (GroupNode *)0x0) {
    (*((local_128.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pAVar6 = Application::instance;
  dVar5 = (double)std::__cxx11::string::string
                            ((string *)local_e8,"flattening scene done",(allocator *)&cam);
  Application::log(pAVar6,dVar5);
  std::__cxx11::string::~string((string *)local_e8);
  if (0 < (this->super_TutorialApplication).super_Application.verbosity) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar10 = std::operator<<((ostream *)&std::cout,"scene statistics (post-flattening):");
    std::endl<char,std::char_traits<char>>(poVar10);
    local_130.ptr = &(flattened_scene.ptr)->super_Node;
    if (flattened_scene.ptr != (GroupNode *)0x0) {
      (*((flattened_scene.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    SceneGraph::calculateStatistics((Statistics *)local_e8,&local_130);
    SceneGraph::Statistics::print((Statistics *)local_e8);
    if ((GroupNode *)local_130.ptr != (GroupNode *)0x0) {
      (*(((Node *)&(local_130.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  local_138.ptr = flattened_scene.ptr;
  if (flattened_scene.ptr != (GroupNode *)0x0) {
    (*((flattened_scene.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  this_00 = &(this->super_TutorialApplication).field_0x318;
  TutorialScene::add((TutorialScene *)this_00,&local_138);
  if (local_138.ptr != (GroupNode *)0x0) {
    (*((local_138.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (flattened_scene.ptr != (GroupNode *)0x0) {
    (*((flattened_scene.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  flattened_scene.ptr = (GroupNode *)0x0;
  pGVar3 = (this->scene).ptr;
  if (pGVar3 != (GroupNode *)0x0) {
    (*(pGVar3->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  (this->scene).ptr = (GroupNode *)0x0;
  pAVar6 = Application::instance;
  dVar5 = (double)std::__cxx11::string::string
                            ((string *)local_e8,"populating tutorial scene done",(allocator *)&cam);
  Application::log(pAVar6,dVar5);
  std::__cxx11::string::~string((string *)local_e8);
  if (this->print_scene_cameras == true) {
    TutorialScene::print_camera_names((TutorialScene *)this_00);
  }
  else {
    bVar8 = std::operator!=(&this->camera_name,"");
    if (bVar8) {
      TutorialScene::getCamera((TutorialScene *)&cam,(string *)this_00);
      (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[0x10])(0,local_e8);
      (this->super_TutorialApplication).camera.from.field_0.m128[0] = (float)local_e8._0_4_;
      (this->super_TutorialApplication).camera.from.field_0.m128[1] = (float)local_e8._4_4_;
      (this->super_TutorialApplication).camera.from.field_0.m128[2] = fStack_e0;
      (this->super_TutorialApplication).camera.from.field_0.m128[3] = fStack_dc;
      (this->super_TutorialApplication).camera.to.field_0.m128[0] =
           (float)local_d8._M_allocated_capacity._0_4_;
      (this->super_TutorialApplication).camera.to.field_0.m128[1] =
           (float)local_d8._M_allocated_capacity._4_4_;
      (this->super_TutorialApplication).camera.to.field_0.m128[2] = (float)local_d8._8_4_;
      (this->super_TutorialApplication).camera.to.field_0.m128[3] = (float)local_d8._12_4_;
      (this->super_TutorialApplication).camera.up.field_0.m128[0] = local_c8;
      (this->super_TutorialApplication).camera.up.field_0.m128[1] = fStack_c4;
      (this->super_TutorialApplication).camera.up.field_0.m128[2] = fStack_c0;
      (this->super_TutorialApplication).camera.up.field_0.m128[3] = fStack_bc;
      (this->super_TutorialApplication).camera.fov = local_b8;
      iVar9 = (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[0xf])();
      if ((char)iVar9 != '\0') {
        if (cam.ptr != (PerspectiveCameraNode *)0x0) {
          (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
        }
        pPVar4 = (this->super_TutorialApplication).animated_camera.ptr;
        if (pPVar4 != (PerspectiveCameraNode *)0x0) {
          (*(pPVar4->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (this->super_TutorialApplication).animated_camera.ptr = cam.ptr;
      }
      if (cam.ptr != (PerspectiveCameraNode *)0x0) {
        (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
    }
    else if (((this->super_TutorialApplication).command_line_camera == false) &&
            (TutorialScene::getDefaultCamera((TutorialScene *)&cam),
            cam.ptr != (PerspectiveCameraNode *)0x0)) {
      (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[0x10])(0,local_e8);
      (this->super_TutorialApplication).camera.from.field_0.m128[0] = (float)local_e8._0_4_;
      (this->super_TutorialApplication).camera.from.field_0.m128[1] = (float)local_e8._4_4_;
      (this->super_TutorialApplication).camera.from.field_0.m128[2] = fStack_e0;
      (this->super_TutorialApplication).camera.from.field_0.m128[3] = fStack_dc;
      (this->super_TutorialApplication).camera.to.field_0.m128[0] =
           (float)local_d8._M_allocated_capacity._0_4_;
      (this->super_TutorialApplication).camera.to.field_0.m128[1] =
           (float)local_d8._M_allocated_capacity._4_4_;
      (this->super_TutorialApplication).camera.to.field_0.m128[2] = (float)local_d8._8_4_;
      (this->super_TutorialApplication).camera.to.field_0.m128[3] = (float)local_d8._12_4_;
      (this->super_TutorialApplication).camera.up.field_0.m128[0] = local_c8;
      (this->super_TutorialApplication).camera.up.field_0.m128[1] = fStack_c4;
      (this->super_TutorialApplication).camera.up.field_0.m128[2] = fStack_c0;
      (this->super_TutorialApplication).camera.up.field_0.m128[3] = fStack_bc;
      (this->super_TutorialApplication).camera.fov = local_b8;
      iVar9 = (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[0xf])();
      if ((char)iVar9 != '\0') {
        if (cam.ptr != (PerspectiveCameraNode *)0x0) {
          (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
        }
        pPVar4 = (this->super_TutorialApplication).animated_camera.ptr;
        if (pPVar4 != (PerspectiveCameraNode *)0x0) {
          (*(pPVar4->super_Node).super_RefCount._vptr_RefCount[3])();
        }
        (this->super_TutorialApplication).animated_camera.ptr = cam.ptr;
      }
      if (cam.ptr != (PerspectiveCameraNode *)0x0) {
        (*((cam.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
    }
    TutorialApplication::set_scene(&this->super_TutorialApplication,(TutorialScene *)this_00);
    pAVar6 = Application::instance;
    dVar5 = (double)std::__cxx11::string::string
                              ((string *)local_e8,"creating ISPC compatible scene done",
                               (allocator *)&cam);
    iVar9 = 1;
    Application::log(pAVar6,dVar5);
    std::__cxx11::string::~string((string *)local_e8);
    TutorialApplication::run(&this->super_TutorialApplication,iVar9,argv_00);
  }
  if (flattened_scene.ptr != (GroupNode *)0x0) {
    (*((flattened_scene.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return 0;
}

Assistant:

int SceneLoadingTutorialApplication::main(int argc, char** argv) try
  {
    /* parse command line options */
    parseCommandLine(argc,argv);

    /* callback */
    try {
      postParseCommandLine();
    }
    catch (const std::exception& e) {
      std::cout << "Error: " << e.what() << std::endl;
    }

    /* create embree device */
    create_device();
    
    log(1,"application start");

    /* execute postponed scene graph operations */
    for (auto& f : futures) f();
    
    /* load scene */
    if (sceneFilename.size())
    {
      for (auto& file : sceneFilename)
      {
        if (toLowerCase(file.ext()) == std::string("obj"))
          scene->add(loadOBJ(file,subdiv_mode != ""));
        else if (file.ext() != "")
          scene->add(SceneGraph::load(file));
      }
    }

    Application::instance->log(1,"loading scene done");

    /* load key frames for animation */
    for (size_t i=0; i<keyFramesFilenames.size(); i++)
    {
      if (verbosity >= 1) 
        std::cout << "Adding ["<< keyFramesFilenames[i] << "] to scene..." << std::flush;
      
      if (toLowerCase(keyFramesFilenames[i].ext()) == std::string("obj"))
        scene->add(loadOBJ(keyFramesFilenames[i],subdiv_mode != "",true));
      else if (keyFramesFilenames[i].ext() != "")
        scene->add(SceneGraph::load(keyFramesFilenames[i]));
      
      if (verbosity >= 1) 
        std::cout << " [DONE]" << std::endl << std::flush;
    }

    /* clear texture cache */
    Texture::clearTextureCache();

    /* perform removals */
    if (remove_mblur)     scene->remove_mblur(true);
    if (remove_non_mblur) scene->remove_mblur(false);

    /* perform conversions */
    if (sgop.size() && verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (pre-convert):" << std::endl;
      SceneGraph::calculateStatistics(scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }

    /* perform scene graph conversions */
    for (auto& op : sgop)
    {
      switch (op) {
      case CONVERT_TRIANGLES_TO_QUADS   : scene->triangles_to_quads(convert_tris_to_quads_prop); break;
      case CONVERT_BEZIER_TO_LINES      : scene->bezier_to_lines(); break;
      case CONVERT_BEZIER_TO_BSPLINE    : scene->bezier_to_bspline(); break;
      case CONVERT_BSPLINE_TO_BEZIER    : scene->bspline_to_bezier(); break;
      case CONVERT_BEZIER_TO_HERMITE    : scene->bezier_to_hermite(); break;
      case CONVERT_FLAT_TO_ROUND_CURVES : scene->flat_to_round_curves(); break;
      case CONVERT_ROUND_TO_FLAT_CURVES : scene->round_to_flat_curves(); break;
      case MERGE_QUADS_TO_GRIDS         : scene->merge_quads_to_grids(); break;
      case CONVERT_QUADS_TO_GRIDS       : scene->quads_to_grids(grid_resX,grid_resY); break;
      case CONVERT_GRIDS_TO_QUADS       : scene->grids_to_quads(); break;
      case CONVERT_MBLUR_TO_NONMBLUR    : convert_mblur_to_nonmblur(scene.dynamicCast<SceneGraph::Node>()); break;
      default : throw std::runtime_error("unsupported scene graph operation");
      }
    }
    Application::instance->log(1,"converting scene done");

    if (verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (pre-flattening):" << std::endl;
      SceneGraph::calculateStatistics(scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }
    
    Ref<SceneGraph::GroupNode> flattened_scene = SceneGraph::flatten(scene,instancing_mode);
    Application::instance->log(1,"flattening scene done");

    if (verbosity >= 1) {
      std::cout << std::endl;
      std::cout << "scene statistics (post-flattening):" << std::endl;
      SceneGraph::calculateStatistics(flattened_scene.dynamicCast<SceneGraph::Node>()).print();
      std::cout << std::endl;
    }

    /* convert model */
    obj_scene.add(flattened_scene);
    flattened_scene = nullptr;
    scene = nullptr;
    Application::instance->log(1,"populating tutorial scene done");
    
    /* print all cameras */
    if (print_scene_cameras) {
      obj_scene.print_camera_names();
      return 0;
    }

    /* use specified camera */
    if (camera_name != "") {
      auto cam = obj_scene.getCamera(camera_name);
      camera = Camera(cam->get(0),camera.handedness);
      if (cam->isAnimated()) animated_camera = cam;
    }

    /* otherwise use default camera */
    else if (!command_line_camera) {
      auto cam = obj_scene.getDefaultCamera();
      if (cam) {
        camera = Camera(cam->get(0),camera.handedness);
        if (cam->isAnimated()) animated_camera = cam;
      }
    }

    /* send model */
    set_scene(&obj_scene);
    Application::instance->log(1,"creating ISPC compatible scene done");

    /* start tutorial */
    run(argc,argv);

    return 0;
  }
  catch (const std::exception& e) {
    std::cout << "Error: " << e.what() << std::endl;
    return 1;
  }
  catch (...) {
    std::cout << "Error: unknown exception caught." << std::endl;
    return 1;
  }